

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  undefined1 auVar8 [16];
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined8 uVar24;
  new_allocator<Person> *pnVar25;
  ctrl_t *pcVar26;
  size_t sVar27;
  ulong uVar28;
  slot_type *psVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  ulong uVar31;
  byte bVar32;
  Person *pPVar33;
  size_t i;
  FindInfo FVar34;
  type raw;
  hash<Person> local_89;
  new_allocator<Person> *local_88;
  long local_80;
  Person local_78;
  
  uVar5 = this->capacity_;
  if ((uVar5 == 0) || ((uVar5 + 1 & uVar5) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                 );
  }
  if (uVar5 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                 );
  }
  pcVar6 = this->ctrl_;
  if (pcVar6[uVar5] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar26 = pcVar6 + uVar5;
  if (pcVar26 + 1 != pcVar6) {
    uVar31 = 0;
    do {
      pcVar1 = pcVar6 + uVar31;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar6 + uVar31);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      uVar31 = uVar31 + 0x10;
    } while (uVar5 + 1 != uVar31);
  }
  uVar24 = *(undefined8 *)(pcVar6 + 8);
  *(undefined8 *)(pcVar26 + 1) = *(undefined8 *)pcVar6;
  *(undefined8 *)(pcVar26 + 9) = uVar24;
  *pcVar26 = -1;
  sVar27 = this->capacity_;
  if (sVar27 != 0) {
    local_88 = (new_allocator<Person> *)&this->settings_;
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        sVar27 = std::hash<Person>::operator()(&local_89,this->slots_ + i);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = sVar27;
        uVar31 = SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar34 = find_first_non_full(this,uVar31);
        sVar27 = FVar34.offset;
        uVar5 = this->capacity_;
        if ((uVar5 + 1 & uVar5) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar28 = uVar31 >> 7 & uVar5;
        bVar32 = (byte)uVar31;
        if (((i - uVar28 ^ sVar27 - uVar28) & uVar5) < 0x10) {
          bVar32 = bVar32 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar27] == -2) {
            set_ctrl(this,sVar27,bVar32 & 0x7f);
            pnVar25 = local_88;
            local_80 = i * 0x48;
            psVar7 = this->slots_;
            __gnu_cxx::new_allocator<Person>::construct<Person,Person>
                      (local_88,&local_78,psVar7 + i);
            __gnu_cxx::new_allocator<Person>::destroy<Person>(pnVar25,psVar7 + i);
            pPVar33 = this->slots_ + sVar27;
            __gnu_cxx::new_allocator<Person>::construct<Person,Person>
                      (pnVar25,(Person *)((long)&(this->slots_->_first)._M_dataplus._M_p + local_80)
                       ,pPVar33);
            __gnu_cxx::new_allocator<Person>::destroy<Person>(pnVar25,pPVar33);
            psVar7 = this->slots_ + sVar27;
            psVar29 = this->slots_ + sVar27;
            paVar30 = &(psVar29->_first).field_2;
            (psVar29->_first)._M_dataplus._M_p = (pointer)paVar30;
            paVar3 = &local_78._first.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._first._M_dataplus._M_p == paVar3) {
              paVar30->_M_allocated_capacity =
                   CONCAT71(local_78._first.field_2._M_allocated_capacity._1_7_,
                            local_78._first.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&(psVar29->_first).field_2 + 8) = local_78._first.field_2._8_8_;
            }
            else {
              (psVar7->_first)._M_dataplus._M_p = local_78._first._M_dataplus._M_p;
              (psVar7->_first).field_2._M_allocated_capacity =
                   CONCAT71(local_78._first.field_2._M_allocated_capacity._1_7_,
                            local_78._first.field_2._M_local_buf[0]);
            }
            (psVar7->_first)._M_string_length = local_78._first._M_string_length;
            local_78._first._M_string_length = 0;
            local_78._first.field_2._M_local_buf[0] = '\0';
            paVar30 = &(psVar7->_last).field_2;
            (psVar7->_last)._M_dataplus._M_p = (pointer)paVar30;
            paVar4 = &local_78._last.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._last._M_dataplus._M_p == paVar4) {
              paVar30->_M_allocated_capacity =
                   CONCAT71(local_78._last.field_2._M_allocated_capacity._1_7_,
                            local_78._last.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&(psVar7->_last).field_2 + 8) = local_78._last.field_2._8_8_;
            }
            else {
              (psVar7->_last)._M_dataplus._M_p = local_78._last._M_dataplus._M_p;
              (psVar7->_last).field_2._M_allocated_capacity =
                   CONCAT71(local_78._last.field_2._M_allocated_capacity._1_7_,
                            local_78._last.field_2._M_local_buf[0]);
            }
            (psVar7->_last)._M_string_length = local_78._last._M_string_length;
            local_78._last._M_string_length = 0;
            local_78._last.field_2._M_local_buf[0] = '\0';
            psVar7->_age = local_78._age;
            local_78._first._M_dataplus._M_p = (pointer)paVar3;
            local_78._last._M_dataplus._M_p = (pointer)paVar4;
            __gnu_cxx::new_allocator<Person>::destroy<Person>(local_88,&local_78);
            i = i - 1;
            goto LAB_0010228b;
          }
          if (this->ctrl_[sVar27] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                         );
          }
          set_ctrl(this,sVar27,bVar32 & 0x7f);
          pnVar25 = local_88;
          pPVar33 = this->slots_ + i;
          __gnu_cxx::new_allocator<Person>::construct<Person,Person>
                    (local_88,this->slots_ + sVar27,pPVar33);
          __gnu_cxx::new_allocator<Person>::destroy<Person>(pnVar25,pPVar33);
          bVar32 = 0x80;
        }
        set_ctrl(this,i,bVar32);
      }
LAB_0010228b:
      i = i + 1;
      sVar27 = this->capacity_;
    } while (i != sVar27);
  }
  reset_growth_left(this,sVar27);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }